

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

void hash_destroy(HashTable *table)

{
  void *pvVar1;
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  HashItem *pHVar3;
  ulong uVar4;
  HashItem *pHVar5;
  
  pvVar1 = table->data;
  UNRECOVERED_JUMPTABLE = table->f;
  pvVar2 = table->d;
  for (uVar4 = 0; uVar4 < table->table_len; uVar4 = uVar4 + 1) {
    pHVar5 = table->table[uVar4];
    while (pHVar5 != (HashItem *)0x0) {
      pHVar3 = pHVar5->next;
      (*table->nuke)(pHVar5->key,pHVar5->value,pvVar1);
      (*UNRECOVERED_JUMPTABLE)(pHVar5,pvVar2);
      pHVar5 = pHVar3;
    }
  }
  (*UNRECOVERED_JUMPTABLE)(table->table,pvVar2);
  (*UNRECOVERED_JUMPTABLE)(table,pvVar2);
  return;
}

Assistant:

void hash_destroy(HashTable *table)
{
    uint32 i;
    void *data = table->data;
    MOJOSHADER_free f = table->f;
    void *d = table->d;
    for (i = 0; i < table->table_len; i++)
    {
        HashItem *item = table->table[i];
        while (item != NULL)
        {
            HashItem *next = item->next;
            table->nuke(item->key, item->value, data);
            f(item, d);
            item = next;
        } // while
    } // for

    f(table->table, d);
    f(table, d);
}